

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O3

BigInt * __thiscall BigInt::operator/(BigInt *__return_storage_ptr__,BigInt *this,longlong val)

{
  pair<BigInt,_long_long> local_38;
  
  divModValue(&local_38,this,val);
  std::vector<long_long,_std::allocator<long_long>_>::vector
            (&__return_storage_ptr__->vector_value,
             (vector<long_long,_std::allocator<long_long>_> *)&local_38);
  __return_storage_ptr__->sign = local_38.first.sign;
  if (local_38.first.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.first.vector_value.
                    super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

BigInt operator/(long long val) const { //! divide by val
        return divModValue(val).first;
    }